

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

string * __thiscall
wallet::(anonymous_namespace)::WalletImpl::getWalletName_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)((long)this + 0x10);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar3 = *(long *)(lVar2 + 0xc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::_M_construct<char*>();
    return __return_storage_ptr__;
  }
  __stack_chk_fail(__return_storage_ptr__,lVar3,*(long *)(lVar2 + 200) + lVar3);
}

Assistant:

std::string getWalletName() override { return m_wallet->GetName(); }